

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

RPCHelpMan * wallet::getbalances(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff448;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff44c;
  undefined8 in_stack_fffffffffffff450;
  undefined8 in_stack_fffffffffffff458;
  undefined8 in_stack_fffffffffffff460;
  _Manager_type in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff478;
  pointer in_stack_fffffffffffff488;
  pointer pRVar5;
  pointer in_stack_fffffffffffff490;
  pointer pRVar6;
  pointer in_stack_fffffffffffff498;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff4a0;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff4c0;
  pointer pRVar11;
  pointer pRVar12;
  pointer pRVar13;
  undefined1 in_stack_fffffffffffff4e0 [24];
  allocator<char> local_afb;
  allocator<char> local_afa;
  allocator_type local_af9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_af8;
  allocator<char> local_ada;
  allocator<char> local_ad9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ad8;
  allocator<char> local_aba;
  allocator<char> local_ab9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ab8;
  allocator<char> local_a9a;
  allocator<char> local_a99;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a98;
  allocator<char> local_a72;
  allocator<char> local_a71;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a70;
  allocator<char> local_a52;
  allocator<char> local_a51;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a50;
  allocator<char> local_a32;
  allocator<char> local_a31;
  RPCResults local_a30;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  char *local_910;
  size_type local_908;
  char local_900 [8];
  undefined8 uStack_8f8;
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  RPCResult local_830 [3];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  RPCResult local_558 [4];
  string local_338 [32];
  string local_318 [32];
  RPCResult local_2f8 [3];
  string local_160 [32];
  string local_140 [32];
  RPCResult local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getbalances",&local_9f1);
  std::operator+(&local_98,"Returns an object with all balances in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_78,&local_98,".\n");
  local_a18.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a18.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a18.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_140,"",&local_a31);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"",&local_a32);
  std::__cxx11::string::string<std::allocator<char>>(local_318,"mine",&local_a51);
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"balances from outputs that the wallet can sign",&local_a52);
  std::__cxx11::string::string<std::allocator<char>>(local_578,"trusted",&local_a71);
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"trusted balance (outputs created by the wallet or confirmed outputs)",
             &local_a72);
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff448;
  m_key_name._M_string_length = in_stack_fffffffffffff450;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff460;
  description._M_string_length = in_stack_fffffffffffff470;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description.field_2 = in_stack_fffffffffffff478;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff490;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff488;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult(local_558,STR_AMOUNT,m_key_name,description,inner,SUB81(local_578,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"untrusted_pending",&local_a99);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,
             "untrusted pending balance (outputs created by others that are in the mempool)",
             &local_a9a);
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff448;
  m_key_name_00._M_string_length = in_stack_fffffffffffff450;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff460;
  description_00._M_string_length = in_stack_fffffffffffff470;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_00.field_2 = in_stack_fffffffffffff478;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff490;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff488;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult
            (local_558 + 1,STR_AMOUNT,m_key_name_00,description_00,inner_00,SUB81(local_5b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5f8,"immature",&local_ab9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,"balance from immature coinbase outputs",&local_aba);
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff448;
  m_key_name_01._M_string_length = in_stack_fffffffffffff450;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff460;
  description_01._M_string_length = in_stack_fffffffffffff470;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_01.field_2 = in_stack_fffffffffffff478;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff490;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff488;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult
            (local_558 + 2,STR_AMOUNT,m_key_name_01,description_01,inner_01,SUB81(local_5f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_638,"used",&local_ad9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,
             "(only present if avoid_reuse is set) balance from coins sent to addresses that were previously spent from (potentially privacy violating)"
             ,&local_ada);
  local_af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = 0;
  auVar1._4_8_ = in_stack_fffffffffffff450;
  auVar1._0_4_ = in_stack_fffffffffffff44c;
  auVar1._12_8_ = in_stack_fffffffffffff458;
  auVar1._20_8_ = in_stack_fffffffffffff460;
  auVar1._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff470;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_02.field_2 = in_stack_fffffffffffff478;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff490;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff488;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult
            (local_558 + 3,STR_AMOUNT,(string)(auVar1 << 0x20),SUB81(local_638,0),description_02,
             inner_02,true);
  __l._M_len = 4;
  __l._M_array = local_558;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_a70,__l,&local_af9);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_02._M_string_length = in_stack_fffffffffffff450;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff460;
  description_03._M_string_length = in_stack_fffffffffffff470;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_03.field_2 = in_stack_fffffffffffff478;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff490;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff488;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult(local_2f8,OBJ,m_key_name_02,description_03,inner_03,SUB81(local_318,0));
  std::__cxx11::string::string<std::allocator<char>>(local_678,"watchonly",&local_afa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_698,"watchonly balances (not present if wallet does not watch anything)",
             &local_afb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_850,"trusted",(allocator<char> *)&stack0xfffffffffffff4e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_870,"trusted balance (outputs created by the wallet or confirmed outputs)",
             (allocator<char> *)&stack0xfffffffffffff4e6);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_03._M_string_length = in_stack_fffffffffffff450;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff460;
  description_04._M_string_length = in_stack_fffffffffffff470;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_04.field_2 = in_stack_fffffffffffff478;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff490;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff488;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult
            (local_830,STR_AMOUNT,m_key_name_03,description_04,inner_04,SUB81(local_850,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_890,"untrusted_pending",(allocator<char> *)&stack0xfffffffffffff4c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b0,
             "untrusted pending balance (outputs created by others that are in the mempool)",
             (allocator<char> *)&stack0xfffffffffffff4c6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_04._M_string_length = in_stack_fffffffffffff450;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff460;
  description_05._M_string_length = in_stack_fffffffffffff470;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_05.field_2 = in_stack_fffffffffffff478;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff490;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff488;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff498;
  RPCResult::RPCResult
            (local_830 + 1,STR_AMOUNT,m_key_name_04,description_05,inner_05,SUB81(local_890,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_8d0,"immature",(allocator<char> *)&stack0xfffffffffffff4a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8f0,"balance from immature coinbase outputs",
             (allocator<char> *)&stack0xfffffffffffff4a6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_05._M_string_length = in_stack_fffffffffffff450;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff460;
  description_06._M_string_length = in_stack_fffffffffffff470;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_06.field_2 = in_stack_fffffffffffff478;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (local_830 + 2,STR_AMOUNT,m_key_name_05,description_06,inner_06,SUB81(local_8d0,0));
  __l_00._M_len = 3;
  __l_00._M_array = local_830;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4e8,__l_00,
             (allocator_type *)&stack0xfffffffffffff487);
  uVar4 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff450;
  auVar2._0_4_ = in_stack_fffffffffffff44c;
  auVar2._12_8_ = in_stack_fffffffffffff458;
  auVar2._20_8_ = in_stack_fffffffffffff460;
  auVar2._28_4_ = 0;
  description_07._M_string_length = in_stack_fffffffffffff470;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_07.field_2._M_local_buf = in_stack_fffffffffffff478._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult
            (local_2f8 + 1,OBJ,(string)(auVar2 << 0x20),SUB81(local_678,0),description_07,inner_07,
             true);
  RPCResult::RPCResult(local_2f8 + 2,(RPCResult *)RESULT_LAST_PROCESSED_BLOCK);
  __l_01._M_len = 3;
  __l_01._M_array = local_2f8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a50,__l_01,(allocator_type *)&stack0xfffffffffffff486);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff44c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_06._M_string_length = in_stack_fffffffffffff450;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff458;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff460;
  description_08._M_string_length = in_stack_fffffffffffff470;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff468;
  description_08.field_2 = in_stack_fffffffffffff478;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_120,OBJ,m_key_name_06,description_08,inner_08,SUB81(local_140,0));
  result._4_4_ = in_stack_fffffffffffff44c;
  result.m_type = uVar4;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff450;
  result.m_key_name._M_string_length = in_stack_fffffffffffff458;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff460;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff468;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff470;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff478;
  result._64_8_ = pRVar5;
  result.m_description._M_dataplus._M_p = (pointer)pRVar6;
  result.m_description._M_string_length = (size_type)pRVar7;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff4a0;
  result.m_description.field_2._8_8_ = pRVar8;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar9;
  result.m_cond._M_string_length = (size_type)pRVar10;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff4c0;
  result.m_cond.field_2._8_8_ = pRVar11;
  RPCResults::RPCResults(&local_a30,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_970,"getbalances",(allocator<char> *)&stack0xfffffffffffff485);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"",(allocator<char> *)&stack0xfffffffffffff484);
  HelpExampleCli(&local_950,&local_970,&local_990);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,"getbalances",(allocator<char> *)&stack0xfffffffffffff483);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"",(allocator<char> *)&stack0xfffffffffffff482);
  HelpExampleRpc(&local_9b0,&local_9d0,&local_9f0);
  std::operator+(&local_930,&local_950,&local_9b0);
  local_910 = local_900;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p == &local_930.field_2) {
    uStack_8f8 = local_930.field_2._8_8_;
  }
  else {
    local_910 = local_930._M_dataplus._M_p;
  }
  local_908 = local_930._M_string_length;
  local_930._M_string_length = 0;
  local_930.field_2._M_local_buf[0] = '\0';
  description_09._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:455:9)>
       ::_M_invoke;
  description_09._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/coins.cpp:455:9)>
                ::_M_manager;
  description_09.field_2 = in_stack_fffffffffffff478;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4a0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  examples.m_examples._M_string_length = in_stack_fffffffffffff4c0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar11;
  examples.m_examples.field_2._8_8_ = pRVar12;
  fun._8_24_ = in_stack_fffffffffffff4e0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff450,&stack0xfffffffffffff458)),
             description_09,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff458);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_970);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a30.m_results);
  RPCResult::~RPCResult(&local_120);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a50);
  lVar3 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_2f8[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4e8);
  lVar3 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_830[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff488);
  std::__cxx11::string::~string(local_8f0);
  std::__cxx11::string::~string(local_8d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4a8);
  std::__cxx11::string::~string(local_8b0);
  std::__cxx11::string::~string(local_890);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4c8);
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_850);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_678);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a70);
  lVar3 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_558[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_af8);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_638);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ad8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_5f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ab8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a98);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_140);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a18);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getbalances()
{
    return RPCHelpMan{
        "getbalances",
        "Returns an object with all balances in " + CURRENCY_UNIT + ".\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::OBJ, "mine", "balances from outputs that the wallet can sign",
                {
                    {RPCResult::Type::STR_AMOUNT, "trusted", "trusted balance (outputs created by the wallet or confirmed outputs)"},
                    {RPCResult::Type::STR_AMOUNT, "untrusted_pending", "untrusted pending balance (outputs created by others that are in the mempool)"},
                    {RPCResult::Type::STR_AMOUNT, "immature", "balance from immature coinbase outputs"},
                    {RPCResult::Type::STR_AMOUNT, "used", /*optional=*/true, "(only present if avoid_reuse is set) balance from coins sent to addresses that were previously spent from (potentially privacy violating)"},
                }},
                {RPCResult::Type::OBJ, "watchonly", /*optional=*/true, "watchonly balances (not present if wallet does not watch anything)",
                {
                    {RPCResult::Type::STR_AMOUNT, "trusted", "trusted balance (outputs created by the wallet or confirmed outputs)"},
                    {RPCResult::Type::STR_AMOUNT, "untrusted_pending", "untrusted pending balance (outputs created by others that are in the mempool)"},
                    {RPCResult::Type::STR_AMOUNT, "immature", "balance from immature coinbase outputs"},
                }},
                RESULT_LAST_PROCESSED_BLOCK,
            }
            },
        RPCExamples{
            HelpExampleCli("getbalances", "") +
            HelpExampleRpc("getbalances", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> rpc_wallet = GetWalletForJSONRPCRequest(request);
    if (!rpc_wallet) return UniValue::VNULL;
    const CWallet& wallet = *rpc_wallet;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    LOCK(wallet.cs_wallet);

    const auto bal = GetBalance(wallet);
    UniValue balances{UniValue::VOBJ};
    {
        UniValue balances_mine{UniValue::VOBJ};
        balances_mine.pushKV("trusted", ValueFromAmount(bal.m_mine_trusted));
        balances_mine.pushKV("untrusted_pending", ValueFromAmount(bal.m_mine_untrusted_pending));
        balances_mine.pushKV("immature", ValueFromAmount(bal.m_mine_immature));
        if (wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
            // If the AVOID_REUSE flag is set, bal has been set to just the un-reused address balance. Get
            // the total balance, and then subtract bal to get the reused address balance.
            const auto full_bal = GetBalance(wallet, 0, false);
            balances_mine.pushKV("used", ValueFromAmount(full_bal.m_mine_trusted + full_bal.m_mine_untrusted_pending - bal.m_mine_trusted - bal.m_mine_untrusted_pending));
        }
        balances.pushKV("mine", std::move(balances_mine));
    }
    auto spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (spk_man && spk_man->HaveWatchOnly()) {
        UniValue balances_watchonly{UniValue::VOBJ};
        balances_watchonly.pushKV("trusted", ValueFromAmount(bal.m_watchonly_trusted));
        balances_watchonly.pushKV("untrusted_pending", ValueFromAmount(bal.m_watchonly_untrusted_pending));
        balances_watchonly.pushKV("immature", ValueFromAmount(bal.m_watchonly_immature));
        balances.pushKV("watchonly", std::move(balances_watchonly));
    }

    AppendLastProcessedBlock(balances, wallet);
    return balances;
},
    };
}